

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O0

double __thiscall
Fir_Resampler_::time_ratio(Fir_Resampler_ *this,double new_factor,double rolloff,double gain)

{
  Fir_Resampler_ *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  short *in_stack_00000010;
  int i;
  double pos;
  double filter;
  double error;
  double nearest;
  int r;
  double pos_1;
  double least_error;
  double fstep;
  int local_64;
  double local_60;
  int local_3c;
  double local_38;
  double local_30;
  double local_28;
  
  in_RDI->ratio_ = in_XMM0_Qa;
  local_28 = 0.0;
  local_30 = 2.0;
  local_38 = 0.0;
  in_RDI->res = -1;
  for (local_3c = 1; local_3c < 0x21; local_3c = local_3c + 1) {
    local_38 = in_RDI->ratio_ + local_38;
    dVar1 = floor(local_38 + 0.5);
    if (ABS(local_38 - dVar1) < local_30) {
      in_RDI->res = local_3c;
      local_28 = dVar1 / (double)in_RDI->res;
      local_30 = ABS(local_38 - dVar1);
    }
  }
  in_RDI->skip_bits = 0;
  dVar1 = floor(local_28);
  in_RDI->step = (int)dVar1 * 2;
  in_RDI->ratio_ = local_28;
  dVar1 = fmod(local_28,1.0);
  local_60 = 0.0;
  in_RDI->input_per_cycle = 0;
  for (local_64 = 0; local_64 < in_RDI->res; local_64 = local_64 + 1) {
    gen_sinc(pos_1,r,nearest,error,filter,pos._4_4_,in_stack_00000010);
    local_60 = dVar1 + local_60;
    in_RDI->input_per_cycle = in_RDI->step + in_RDI->input_per_cycle;
    if (0.9999999 <= local_60) {
      local_60 = local_60 - 1.0;
      in_RDI->skip_bits = 1 << ((byte)local_64 & 0x1f) | in_RDI->skip_bits;
      in_RDI->input_per_cycle = in_RDI->input_per_cycle + 1;
    }
  }
  clear(in_RDI);
  return in_RDI->ratio_;
}

Assistant:

double Fir_Resampler_::time_ratio( double new_factor, double rolloff, double gain )
{
	ratio_ = new_factor;
	
	double fstep = 0.0;
	{
		double least_error = 2;
		double pos = 0;
		res = -1;
		for ( int r = 1; r <= max_res; r++ )
		{
			pos += ratio_;
			double nearest = floor( pos + 0.5 );
			double error = fabs( pos - nearest );
			if ( error < least_error )
			{
				res = r;
				fstep = nearest / res;
				least_error = error;
			}
		}
	}
	
	skip_bits = 0;
	
	step = stereo * (int) floor( fstep );
	
	ratio_ = fstep;
	fstep = fmod( fstep, 1.0 );
	
	double filter = (ratio_ < 1.0) ? 1.0 : 1.0 / ratio_;
	double pos = 0.0;
	input_per_cycle = 0;
	for ( int i = 0; i < res; i++ )
	{
		gen_sinc( rolloff, int (width_ * filter + 1) & ~1, pos, filter,
				double (0x7FFF * gain * filter),
				(int) width_, impulses + i * width_ );
		
		pos += fstep;
		input_per_cycle += step;
		if ( pos >= 0.9999999 )
		{
			pos -= 1.0;
			skip_bits |= 1 << i;
			input_per_cycle++;
		}
	}
	
	clear();
	
	return ratio_;
}